

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O3

void __thiscall
fmt::v11::buffered_file::buffered_file(buffered_file *this,cstring_view filename,cstring_view mode)

{
  FILE *pFVar1;
  uint *puVar2;
  undefined8 uVar3;
  string_view fmt;
  format_args args;
  
  do {
    pFVar1 = fopen(filename.data_,mode.data_);
    this->file_ = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      return;
    }
    puVar2 = (uint *)__errno_location();
  } while (*puVar2 == 4);
  uVar3 = __cxa_allocate_exception(0x20);
  fmt.data_ = (char *)(ulong)*puVar2;
  fmt.size_ = (size_t)"cannot open file {}";
  args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                 (value<fmt::v11::context> *)0xc;
  args.desc_ = 0x13;
  vsystem_error((int)uVar3,fmt,args);
  __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

buffered_file::buffered_file(cstring_view filename, cstring_view mode) {
  FMT_RETRY_VAL(file_, FMT_SYSTEM(fopen(filename.c_str(), mode.c_str())),
                nullptr);
  if (!file_)
    FMT_THROW(system_error(errno, FMT_STRING("cannot open file {}"),
                           filename.c_str()));
}